

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleTree::child(QAccessibleTree *this,int logicalIndex)

{
  ChildCache *this_00;
  Span *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Role role_;
  undefined4 uVar5;
  QAbstractItemView *this_01;
  QAbstractItemModel *pQVar6;
  QAccessibleTableCell *this_02;
  QHeaderView *pQVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  const_iterator cVar9;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  int logicalIndex_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  logicalIndex_local = logicalIndex;
  this_01 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
  if (this_01 != (QAbstractItemView *)0x0) {
    pQVar6 = QAbstractItemView::model(this_01);
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_01);
    if ((pQVar6 != (QAbstractItemModel *)0x0 && -1 < logicalIndex) &&
       (iVar2 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_58), iVar2 != 0)) {
      this_00 = &(this->super_QAccessibleTable).childToId;
      cVar9 = QHash<int,_unsigned_int>::constFindImpl<int>(this_00,&logicalIndex_local);
      iVar2 = logicalIndex_local;
      if (cVar9.i.d != (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 || cVar9.i.bucket != 0) {
        pSVar1 = (cVar9.i.d)->spans;
        uVar8 = cVar9.i.bucket >> 7;
        this_02 = (QAccessibleTableCell *)
                  QAccessible::accessibleInterface
                            (*(uint *)(pSVar1[uVar8].entries
                                       [pSVar1[uVar8].offsets[(uint)cVar9.i.bucket & 0x7f]].storage.
                                       data + 4));
        goto LAB_004dc38f;
      }
      pQVar7 = QAccessibleTable::horizontalHeader(&this->super_QAccessibleTable);
      if (pQVar7 == (QHeaderView *)0x0) {
LAB_004dc2cb:
        iVar3 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_58);
        iVar4 = (**(code **)(*(long *)pQVar6 + 0x80))
                          (pQVar6,&local_58,(long)iVar2 % (long)iVar3 & 0xffffffff);
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        indexFromLogical((QModelIndex *)&local_78,this,iVar2 / iVar3,iVar2 % iVar4);
        if ((((int)local_78 < 0) || ((long)local_78 < 0)) ||
           (local_68.ptr == (QAbstractItemModel *)0x0)) goto LAB_004dc38c;
        this_02 = (QAccessibleTableCell *)operator_new(0x38);
        role_ = QAccessibleTable::cellRole(&this->super_QAccessibleTable);
        QAccessibleTableCell::QAccessibleTableCell
                  (this_02,(QAbstractItemView *)this_01,(QModelIndex *)&local_78,role_);
      }
      else {
        iVar3 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_58);
        if (iVar3 <= iVar2) {
          iVar3 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_58);
          iVar2 = iVar2 - iVar3;
          goto LAB_004dc2cb;
        }
        this_02 = (QAccessibleTableCell *)operator_new(0x20);
        QAccessibleTableHeaderCell::QAccessibleTableHeaderCell
                  ((QAccessibleTableHeaderCell *)this_02,(QAbstractItemView *)this_01,iVar2,
                   Horizontal);
      }
      QAccessible::registerAccessibleInterface(&this_02->super_QAccessibleInterface);
      uVar5 = QAccessible::uniqueId(&this_02->super_QAccessibleInterface);
      local_78 = (undefined1 *)CONCAT44(local_78._4_4_,uVar5);
      QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                ((QHash<int,unsigned_int> *)this_00,&logicalIndex_local,(uint *)&local_78);
      goto LAB_004dc38f;
    }
  }
LAB_004dc38c:
  this_02 = (QAccessibleTableCell *)0x0;
LAB_004dc38f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &this_02->super_QAccessibleInterface;
}

Assistant:

QAccessibleInterface *QAccessibleTree::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;
    const QAbstractItemModel *theModel = theView->model();
    const QModelIndex rootIndex = theView->rootIndex();
    if (logicalIndex < 0 || !theModel || !theModel->columnCount(rootIndex))
        return nullptr;

    auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    QAccessibleInterface *iface = nullptr;
    int index = logicalIndex;

    if (horizontalHeader()) {
        if (index < theModel->columnCount(rootIndex))
            iface = new QAccessibleTableHeaderCell(theView, index, Qt::Horizontal);
        else
            index -= theModel->columnCount(rootIndex);
    }

    if (!iface) {
        const int row = index / theModel->columnCount(rootIndex);
        const int column = index % theModel->columnCount(rootIndex);
        const QModelIndex modelIndex = indexFromLogical(row, column);
        if (!modelIndex.isValid())
            return nullptr;
        iface = new QAccessibleTableCell(theView, modelIndex, cellRole());
    }
    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}